

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

_Bool apply_paint(render_state_t *state,render_context_t *context,paint_t *paint)

{
  _Bool _Var1;
  plutovg_color_t pVar2;
  undefined1 local_70 [8];
  plutovg_color_t color_2;
  element_t *ref;
  undefined1 local_50 [8];
  undefined1 local_48 [8];
  plutovg_color_t color_1;
  plutovg_color_t color;
  paint_t *paint_local;
  render_context_t *context_local;
  render_state_t *state_local;
  
  if (paint->type == paint_type_none) {
    return false;
  }
  if (paint->type == paint_type_color) {
    join_0x00001240_0x00001200_ = resolve_color(context,state->element,&paint->color);
    plutovg_canvas_set_color(context->canvas,(plutovg_color_t *)&color_1.b);
    return true;
  }
  if (paint->type == paint_type_var) {
    if ((context->palette_func == (plutosvg_palette_func_t)0x0) ||
       (_Var1 = (*context->palette_func)
                          (context->closure,(paint->id).data,(int)(paint->id).length,
                           (plutovg_color_t *)local_48), !_Var1)) {
      pVar2 = resolve_color(context,state->element,&paint->color);
      ref = pVar2._0_8_;
      local_48 = (undefined1  [8])ref;
      local_50 = pVar2._8_8_;
      color_1.r = (float)local_50._0_4_;
      color_1.g = (float)local_50._4_4_;
    }
    plutovg_canvas_set_color(context->canvas,(plutovg_color_t *)local_48);
    return true;
  }
  color_2._8_8_ = find_element(context->document,&paint->id);
  if ((element_t *)color_2._8_8_ == (element_t *)0x0) {
    _local_70 = resolve_color(context,state->element,&paint->color);
    plutovg_canvas_set_color(context->canvas,(plutovg_color_t *)local_70);
    return true;
  }
  if (((element_t *)color_2._8_8_)->id == 8) {
    _Var1 = apply_linear_gradient(state,context,(element_t *)color_2._8_8_);
    return _Var1;
  }
  if (((element_t *)color_2._8_8_)->id == 0xc) {
    _Var1 = apply_radial_gradient(state,context,(element_t *)color_2._8_8_);
    return _Var1;
  }
  return false;
}

Assistant:

static bool apply_paint(render_state_t* state, const render_context_t* context, const paint_t* paint)
{
    if(paint->type == paint_type_none)
        return false;
    if(paint->type == paint_type_color) {
        plutovg_color_t color = resolve_color(context, state->element, &paint->color);
        plutovg_canvas_set_color(context->canvas, &color);
        return true;
    }

    if(paint->type == paint_type_var) {
        plutovg_color_t color;
        if(!context->palette_func || !context->palette_func(context->closure, paint->id.data, paint->id.length, &color))
            color = resolve_color(context, state->element, &paint->color);
        plutovg_canvas_set_color(context->canvas, &color);
        return true;
    }

    const element_t* ref = find_element(context->document, &paint->id);
    if(ref == NULL) {
        plutovg_color_t color = resolve_color(context, state->element, &paint->color);
        plutovg_canvas_set_color(context->canvas, &color);
        return true;
    }

    if(ref->id == TAG_LINEAR_GRADIENT)
        return apply_linear_gradient(state, context, ref);
    if(ref->id == TAG_RADIAL_GRADIENT)
        return apply_radial_gradient(state, context, ref);
    return false;
}